

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.cpp
# Opt level: O0

int __thiscall
zmq::socks_auth_response_decoder_t::input(socks_auth_response_decoder_t *this,fd_t fd_)

{
  int iVar1;
  char *in_RDI;
  fd_t unaff_retaddr;
  int rc;
  char *size_;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  size_ = in_RDI;
  if (1 < *(ulong *)(in_RDI + 8)) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_bytes_read < 2",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socks.cpp"
            ,0xc4);
    fflush(_stderr);
    zmq_abort((char *)0x24c383);
  }
  iVar1 = tcp_read(unaff_retaddr,
                   (void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                   (size_t)size_);
  if ((0 < iVar1) &&
     (*(long *)(in_RDI + 8) = (long)iVar1 + *(long *)(in_RDI + 8), *in_RDI != '\x01')) {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int zmq::socks_auth_response_decoder_t::input (fd_t fd_)
{
    zmq_assert (_bytes_read < 2);
    const int rc = tcp_read (fd_, _buf + _bytes_read, 2 - _bytes_read);
    if (rc > 0) {
        _bytes_read += static_cast<size_t> (rc);
        if (_buf[0] != 0x01)
            return -1;
    }
    return rc;
}